

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantum.cpp
# Opt level: O1

void __thiscall quantum::QuantumComputer::resetState(QuantumComputer *this)

{
  pointer __s;
  pointer pdVar1;
  pointer pdVar2;
  char *pcVar3;
  
  __s = (this->baseVector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar1 = (this->baseVector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s < pdVar1) {
    pdVar2 = __s + 1;
    if (__s + 1 < pdVar1) {
      pdVar2 = pdVar1;
    }
    memset(__s,0,(~(ulong)__s + (long)pdVar2 & 0xfffffffffffffff8) + 8);
  }
  if (pdVar1 != __s) {
    *__s = 1.0;
    return;
  }
  pcVar3 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  if (1 < (uint)pcVar3) {
    integerToBinary((int)(((uint)((ulong)pcVar3 >> 0x1f) & 1) + (uint)pcVar3) >> 1);
  }
  return;
}

Assistant:

void quantum::QuantumComputer::resetState() {
    std::vector<double>::iterator it;
    for (it = this->baseVector.begin(); it < this->baseVector.end(); it++) {
        *it = 0.0;
    }
    this->baseVector.at(0) = 1;
}